

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_region.cc
# Opt level: O3

S2PointRegion * __thiscall S2PointRegion::Clone(S2PointRegion *this)

{
  VType VVar1;
  bool bVar2;
  S2PointRegion *pSVar3;
  S2LogMessage local_20;
  
  pSVar3 = (S2PointRegion *)operator_new(0x20);
  (pSVar3->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2PointRegion_002bcaf8;
  VVar1 = (this->point_).c_[1];
  (pSVar3->point_).c_[0] = (this->point_).c_[0];
  (pSVar3->point_).c_[1] = VVar1;
  (pSVar3->point_).c_[2] = (this->point_).c_[2];
  bVar2 = S2::IsUnitLength(&this->point_);
  if (bVar2) {
    return pSVar3;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_region.h"
             ,0x49,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_20.stream_,"Check failed: S2::IsUnitLength(point) ",0x26);
  abort();
}

Assistant:

S2PointRegion* S2PointRegion::Clone() const {
  return new S2PointRegion(point_);
}